

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

void FIX::process_sleep(double s)

{
  int iVar1;
  double dVar2;
  timespec time;
  timespec remainder;
  double intpart;
  timespec local_38;
  timespec local_28;
  double local_18;
  
  dVar2 = modf(s,&local_18);
  local_38.tv_nsec = (long)(dVar2 * 1000000000.0);
  local_38.tv_sec = (__time_t)(int)local_18;
  iVar1 = nanosleep(&local_38,&local_28);
  if (iVar1 == -1) {
    do {
      local_38.tv_sec = local_28.tv_sec;
      local_38.tv_nsec = local_28.tv_nsec;
      iVar1 = nanosleep(&local_38,&local_28);
    } while (iVar1 == -1);
  }
  return;
}

Assistant:

void process_sleep(double s) {
#ifdef _MSC_VER
  Sleep((long)(s * 1000));
#else
  timespec time, remainder;
  double intpart;
  time.tv_nsec = (long)(modf(s, &intpart) * 1e9);
  time.tv_sec = (int)intpart;
  while (nanosleep(&time, &remainder) == -1) {
    time = remainder;
  }
#endif
}